

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

void create_file(char *name)

{
  undefined1 local_1d0 [8];
  uv_fs_t req;
  uv_file file;
  int r;
  char *name_local;
  
  req.bufsml[3].len._0_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_1d0,name,0x41,0x180,(uv_fs_cb)0x0);
  req.bufsml[3].len._4_4_ = (int)req.bufsml[3].len;
  if ((int)req.bufsml[3].len < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
            ,0x5b,"r >= 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1d0);
  req.bufsml[3].len._4_4_ =
       uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)local_1d0,(int)req.bufsml[3].len,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
            ,0x5f,"r == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1d0);
  return;
}

Assistant:

static void create_file(const char* name) {
  int r;
  uv_file file;
  uv_fs_t req;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  file = r;
  uv_fs_req_cleanup(&req);
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
}